

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O2

void jpeg_set_colorspace(j_compress_ptr cinfo,J_COLOR_SPACE colorspace)

{
  undefined8 *puVar1;
  int iVar2;
  jpeg_error_mgr *pjVar3;
  jpeg_component_info *pjVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar2 = cinfo->global_state;
  if (iVar2 != 100) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x15;
    (pjVar3->msg_parm).i[0] = iVar2;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  cinfo->jpeg_color_space = colorspace;
  cinfo->write_JFIF_header = 0;
  cinfo->write_Adobe_marker = 0;
  switch(colorspace) {
  case JCS_UNKNOWN:
    uVar5 = cinfo->input_components;
    cinfo->num_components = uVar5;
    if (uVar5 - 0xb < 0xfffffff6) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x1b;
      (pjVar3->msg_parm).i[0] = uVar5;
      (cinfo->err->msg_parm).i[1] = 10;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      uVar5 = cinfo->num_components;
    }
    uVar7 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar7;
    }
    for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      pjVar4 = cinfo->comp_info;
      *(int *)((long)&pjVar4->component_id + uVar7) = (int)uVar8;
      puVar1 = (undefined8 *)((long)&pjVar4->h_samp_factor + uVar7);
      *puVar1 = 0x100000001;
      puVar1[1] = 0;
      *(undefined4 *)((long)&pjVar4->ac_tbl_no + uVar7) = 0;
      uVar7 = uVar7 + 0x60;
    }
    break;
  case JCS_GRAYSCALE:
    cinfo->write_JFIF_header = 1;
    cinfo->num_components = 1;
    pjVar4 = cinfo->comp_info;
    pjVar4->component_id = 1;
    pjVar4->h_samp_factor = 1;
    pjVar4->v_samp_factor = 1;
    pjVar4->quant_tbl_no = 0;
    pjVar4->dc_tbl_no = 0;
    pjVar4->ac_tbl_no = 0;
    break;
  case JCS_RGB:
    cinfo->write_Adobe_marker = 1;
    cinfo->num_components = 3;
    pjVar4 = cinfo->comp_info;
    pjVar4->component_id = 0x52;
    pjVar4->h_samp_factor = 1;
    pjVar4->v_samp_factor = 1;
    pjVar4->quant_tbl_no = 0;
    pjVar4->dc_tbl_no = 0;
    pjVar4->ac_tbl_no = 0;
    pjVar4[1].component_id = 0x47;
    pjVar4[1].h_samp_factor = 1;
    pjVar4[1].v_samp_factor = 1;
    pjVar4[1].quant_tbl_no = 0;
    pjVar4[1].dc_tbl_no = 0;
    pjVar4[1].ac_tbl_no = 0;
    pjVar4[2].component_id = 0x42;
    pjVar4[2].h_samp_factor = 1;
    pjVar4[2].v_samp_factor = 1;
    pjVar4[2].quant_tbl_no = 0;
    pjVar4[2].dc_tbl_no = 0;
    pjVar4[2].ac_tbl_no = 0;
    break;
  case JCS_YCbCr:
    cinfo->write_JFIF_header = 1;
    cinfo->num_components = 3;
    pjVar4 = cinfo->comp_info;
    pjVar4->component_id = 1;
    pjVar4->h_samp_factor = 2;
    pjVar4->v_samp_factor = 2;
    pjVar4->quant_tbl_no = 0;
    pjVar4->dc_tbl_no = 0;
    pjVar4->ac_tbl_no = 0;
    pjVar4[1].component_id = 2;
    pjVar4[1].h_samp_factor = 1;
    pjVar4[1].v_samp_factor = 1;
    pjVar4[1].quant_tbl_no = 1;
    pjVar4[1].dc_tbl_no = 1;
    pjVar4[1].ac_tbl_no = 1;
    pjVar4[2].component_id = 3;
    pjVar4[2].h_samp_factor = 1;
    pjVar4[2].v_samp_factor = 1;
    pjVar4[2].quant_tbl_no = 1;
    pjVar4[2].dc_tbl_no = 1;
    pjVar4[2].ac_tbl_no = 1;
    break;
  case JCS_CMYK:
    cinfo->write_Adobe_marker = 1;
    cinfo->num_components = 4;
    pjVar4 = cinfo->comp_info;
    pjVar4->component_id = 0x43;
    pjVar4->h_samp_factor = 1;
    pjVar4->v_samp_factor = 1;
    pjVar4->quant_tbl_no = 0;
    pjVar4->dc_tbl_no = 0;
    pjVar4->ac_tbl_no = 0;
    pjVar4[1].component_id = 0x4d;
    pjVar4[1].h_samp_factor = 1;
    pjVar4[1].v_samp_factor = 1;
    pjVar4[1].quant_tbl_no = 0;
    pjVar4[1].dc_tbl_no = 0;
    pjVar4[1].ac_tbl_no = 0;
    pjVar4[2].component_id = 0x59;
    pjVar4[2].h_samp_factor = 1;
    pjVar4[2].v_samp_factor = 1;
    pjVar4[2].quant_tbl_no = 0;
    pjVar4[2].dc_tbl_no = 0;
    pjVar4[2].ac_tbl_no = 0;
    pjVar4[3].component_id = 0x4b;
    pjVar4[3].h_samp_factor = 1;
    pjVar4[3].v_samp_factor = 1;
    pjVar4[3].quant_tbl_no = 0;
    pjVar4[3].dc_tbl_no = 0;
    pjVar4[3].ac_tbl_no = 0;
    break;
  case JCS_YCCK:
    cinfo->write_Adobe_marker = 1;
    cinfo->num_components = 4;
    pjVar4 = cinfo->comp_info;
    pjVar4->component_id = 1;
    pjVar4->h_samp_factor = 2;
    pjVar4->v_samp_factor = 2;
    pjVar4->quant_tbl_no = 0;
    pjVar4->dc_tbl_no = 0;
    pjVar4->ac_tbl_no = 0;
    pjVar4[1].component_id = 2;
    pjVar4[1].h_samp_factor = 1;
    pjVar4[1].v_samp_factor = 1;
    pjVar4[1].quant_tbl_no = 1;
    pjVar4[1].dc_tbl_no = 1;
    pjVar4[1].ac_tbl_no = 1;
    pjVar4[2].component_id = 3;
    pjVar4[2].h_samp_factor = 1;
    pjVar4[2].v_samp_factor = 1;
    pjVar4[2].quant_tbl_no = 1;
    pjVar4[2].dc_tbl_no = 1;
    pjVar4[2].ac_tbl_no = 1;
    pjVar4[3].component_id = 4;
    pjVar4[3].h_samp_factor = 2;
    pjVar4[3].v_samp_factor = 2;
    pjVar4[3].quant_tbl_no = 0;
    pjVar4[3].dc_tbl_no = 0;
    pjVar4[3].ac_tbl_no = 0;
    break;
  default:
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0xb;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
    return;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_colorspace (j_compress_ptr cinfo, J_COLOR_SPACE colorspace)
{
  jpeg_component_info * compptr;
  int ci;

#define SET_COMP(index,id,hsamp,vsamp,quant,dctbl,actbl)  \
  (compptr = &cinfo->comp_info[index], \
   compptr->component_id = (id), \
   compptr->h_samp_factor = (hsamp), \
   compptr->v_samp_factor = (vsamp), \
   compptr->quant_tbl_no = (quant), \
   compptr->dc_tbl_no = (dctbl), \
   compptr->ac_tbl_no = (actbl) )

  /* Safety check to ensure start_compress not called yet. */
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* For all colorspaces, we use Q and Huff tables 0 for luminance components,
   * tables 1 for chrominance components.
   */

  cinfo->jpeg_color_space = colorspace;

  cinfo->write_JFIF_header = FALSE; /* No marker for non-JFIF colorspaces */
  cinfo->write_Adobe_marker = FALSE; /* write no Adobe marker by default */

  switch (colorspace) {
  case JCS_GRAYSCALE:
    cinfo->write_JFIF_header = TRUE; /* Write a JFIF marker */
    cinfo->num_components = 1;
    /* JFIF specifies component ID 1 */
    SET_COMP(0, 1, 1,1, 0, 0,0);
    break;
  case JCS_RGB:
    cinfo->write_Adobe_marker = TRUE; /* write Adobe marker to flag RGB */
    cinfo->num_components = 3;
    SET_COMP(0, 0x52 /* 'R' */, 1,1, 0, 0,0);
    SET_COMP(1, 0x47 /* 'G' */, 1,1, 0, 0,0);
    SET_COMP(2, 0x42 /* 'B' */, 1,1, 0, 0,0);
    break;
  case JCS_YCbCr:
    cinfo->write_JFIF_header = TRUE; /* Write a JFIF marker */
    cinfo->num_components = 3;
    /* JFIF specifies component IDs 1,2,3 */
    /* We default to 2x2 subsamples of chrominance */
    SET_COMP(0, 1, 2,2, 0, 0,0);
    SET_COMP(1, 2, 1,1, 1, 1,1);
    SET_COMP(2, 3, 1,1, 1, 1,1);
    break;
  case JCS_CMYK:
    cinfo->write_Adobe_marker = TRUE; /* write Adobe marker to flag CMYK */
    cinfo->num_components = 4;
    SET_COMP(0, 0x43 /* 'C' */, 1,1, 0, 0,0);
    SET_COMP(1, 0x4D /* 'M' */, 1,1, 0, 0,0);
    SET_COMP(2, 0x59 /* 'Y' */, 1,1, 0, 0,0);
    SET_COMP(3, 0x4B /* 'K' */, 1,1, 0, 0,0);
    break;
  case JCS_YCCK:
    cinfo->write_Adobe_marker = TRUE; /* write Adobe marker to flag YCCK */
    cinfo->num_components = 4;
    SET_COMP(0, 1, 2,2, 0, 0,0);
    SET_COMP(1, 2, 1,1, 1, 1,1);
    SET_COMP(2, 3, 1,1, 1, 1,1);
    SET_COMP(3, 4, 2,2, 0, 0,0);
    break;
  case JCS_UNKNOWN:
    cinfo->num_components = cinfo->input_components;
    if (cinfo->num_components < 1 || cinfo->num_components > MAX_COMPONENTS)
      ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->num_components,
	       MAX_COMPONENTS);
    for (ci = 0; ci < cinfo->num_components; ci++) {
      SET_COMP(ci, ci, 1,1, 0, 0,0);
    }
    break;
  default:
    ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
  }
}